

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall HFFilteredConsumer::~HFFilteredConsumer(HFFilteredConsumer *this)

{
  HFFilteredConsumer *in_RDI;
  
  ~HFFilteredConsumer(in_RDI);
  operator_delete(in_RDI,0x420);
  return;
}

Assistant:

HFFilteredConsumer::~HFFilteredConsumer(){
    delete [] input;
}